

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void libxml_xmlXPathFuncCallback(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  PyObject *op;
  PyObject *pPVar5;
  xmlXPathObjectPtr pxVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) ||
     (pxVar1 = ctxt->context, pxVar1 == (xmlXPathContextPtr)0x0)) {
    return;
  }
  pxVar2 = pxVar1->function;
  pxVar3 = pxVar1->functionURI;
  lVar7 = 0;
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < libxml_xpathCallbacksNb; lVar9 = lVar9 + 1) {
    iVar4 = xmlStrEqual(pxVar2);
    if (iVar4 != 0) {
      iVar4 = xmlStrEqual(pxVar3);
      if (iVar4 != 0) {
        lVar8 = *(long *)(libxml_xpathCallbacks + lVar7 + 0x18);
      }
    }
    lVar7 = lVar7 + 0x20;
  }
  if (lVar8 != 0) {
    op = (PyObject *)PyTuple_New((long)(nargs + 1));
    pPVar5 = libxml_xmlXPathParserContextPtrWrap(ctxt);
    PyTuple_SetItem(op,0,pPVar5);
    for (uVar10 = (ulong)(uint)nargs; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
      pxVar6 = (xmlXPathObjectPtr)valuePop(ctxt);
      pPVar5 = libxml_xmlXPathObjectPtrWrap(pxVar6);
      PyTuple_SetItem(op,uVar10,pPVar5);
    }
    pPVar5 = (PyObject *)PyEval_CallObjectWithKeywords(lVar8,op,0);
    _Py_DECREF(op);
    pxVar6 = libxml_xmlXPathObjectPtrConvert(pPVar5);
    valuePush(ctxt,pxVar6);
    return;
  }
  printf("libxml_xmlXPathFuncCallback: internal error %s not found !\n",pxVar2);
  return;
}

Assistant:

static void
libxml_xmlXPathFuncCallback(xmlXPathParserContextPtr ctxt, int nargs)
{
    PyObject *list, *cur, *result;
    xmlXPathObjectPtr obj;
    xmlXPathContextPtr rctxt;
    PyObject *current_function = NULL;
    const xmlChar *name;
    const xmlChar *ns_uri;
    int i;

    if (ctxt == NULL)
        return;
    rctxt = ctxt->context;
    if (rctxt == NULL)
        return;
    name = rctxt->function;
    ns_uri = rctxt->functionURI;
#ifdef DEBUG_XPATH
    printf("libxml_xmlXPathFuncCallback called name %s URI %s\n", name,
           ns_uri);
#endif

    /*
     * Find the function, it should be there it was there at lookup
     */
    for (i = 0; i < libxml_xpathCallbacksNb; i++) {
        if (                    /* TODO (ctxt == libxml_xpathCallbacks[i].ctx) && */
						(xmlStrEqual(name, (*libxml_xpathCallbacks)[i].name)) &&
               (xmlStrEqual(ns_uri, (*libxml_xpathCallbacks)[i].ns_uri))) {
					current_function = (*libxml_xpathCallbacks)[i].function;
        }
    }
    if (current_function == NULL) {
        printf
            ("libxml_xmlXPathFuncCallback: internal error %s not found !\n",
             name);
        return;
    }

    list = PyTuple_New(nargs + 1);
    PyTuple_SetItem(list, 0, libxml_xmlXPathParserContextPtrWrap(ctxt));
    for (i = nargs - 1; i >= 0; i--) {
        obj = valuePop(ctxt);
        cur = libxml_xmlXPathObjectPtrWrap(obj);
        PyTuple_SetItem(list, i + 1, cur);
    }
    result = PyEval_CallObject(current_function, list);
    Py_DECREF(list);

    obj = libxml_xmlXPathObjectPtrConvert(result);
    valuePush(ctxt, obj);
}